

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Clara::Parser::writeToStream(Parser *this,ostream *os)

{
  pointer pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  ulong uVar6;
  HelpColumns *cols;
  pointer pHVar7;
  ulong uVar8;
  Arg *arg;
  pointer pAVar9;
  Columns row;
  vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_> rows
  ;
  Columns local_128;
  string local_110;
  Column local_f0;
  Column local_b0;
  Column local_70;
  
  if (((this->m_exeName).m_name.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_M_string_length != 0) {
    poVar5 = std::operator<<(os,"usage:\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = std::operator<<(poVar5,(string *)
                                    (this->m_exeName).m_name.
                                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
    std::operator<<(poVar5,' ');
    pAVar1 = (this->m_args).
             super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar3 = true;
    bVar2 = true;
    for (pAVar9 = (this->m_args).
                  super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
                  super__Vector_impl_data._M_start; pAVar9 != pAVar1; pAVar9 = pAVar9 + 1) {
      if (!bVar3) {
        std::operator<<(os,' ');
      }
      if (((pAVar9->super_ParserRefImpl<Catch::Clara::Arg>).m_optionality == Optional) && (bVar2)) {
        std::operator<<(os,'[');
        bVar2 = false;
      }
      poVar5 = std::operator<<(os,'<');
      poVar5 = (ostream *)
               std::ostream::write((char *)poVar5,
                                   (long)(pAVar9->super_ParserRefImpl<Catch::Clara::Arg>).m_hint.
                                         m_start);
      std::operator<<(poVar5,'>');
      iVar4 = (*(pAVar9->super_ParserRefImpl<Catch::Clara::Arg>).
                super_ComposableParserImpl<Catch::Clara::Arg>.super_ParserBase._vptr_ParserBase[4])
                        (pAVar9);
      if (CONCAT44(extraout_var,iVar4) == 0) {
        std::operator<<(os," ... ");
      }
      bVar3 = false;
    }
    if (!bVar2) {
      std::operator<<(os,']');
    }
    if ((this->m_options).super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_options).super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::operator<<(os," options");
    }
    std::operator<<(os,"\n\nwhere options are:\n");
  }
  getHelpColumns(&rows,this);
  uVar6 = 0;
  for (pHVar7 = rows.
                super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar7 != rows.
                super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_finish; pHVar7 = pHVar7 + 1) {
    uVar8 = (pHVar7->left)._M_string_length + 2;
    if (uVar6 <= uVar8) {
      uVar6 = uVar8;
    }
  }
  uVar8 = 0x28;
  if (uVar6 < 0x28) {
    uVar8 = uVar6;
  }
  for (pHVar7 = rows.
                super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pHVar7 != rows.
                super__Vector_base<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_finish; pHVar7 = pHVar7 + 1) {
    TextFlow::Column::Column(&local_f0,&pHVar7->left);
    local_f0.m_indent = 2;
    local_f0.m_width = uVar8;
    TextFlow::Spacer(&local_70,4);
    TextFlow::operator+(&local_128,&local_f0,&local_70);
    StringRef::operator_cast_to_string(&local_110,&pHVar7->descriptions);
    TextFlow::Column::Column(&local_b0,&local_110);
    local_b0.m_width = 0x49 - uVar8;
    TextFlow::operator+(&row,&local_128,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
              (&local_128.m_columns);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
    TextFlow::operator<<(os,&row);
    std::operator<<(os,'\n');
    std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::~vector
              (&row.m_columns);
  }
  std::vector<Catch::Clara::Detail::HelpColumns,_std::allocator<Catch::Clara::Detail::HelpColumns>_>
  ::~vector(&rows);
  return;
}

Assistant:

void Parser::writeToStream( std::ostream& os ) const {
            if ( !m_exeName.name().empty() ) {
                os << "usage:\n"
                   << "  " << m_exeName.name() << ' ';
                bool required = true, first = true;
                for ( auto const& arg : m_args ) {
                    if ( first )
                        first = false;
                    else
                        os << ' ';
                    if ( arg.isOptional() && required ) {
                        os << '[';
                        required = false;
                    }
                    os << '<' << arg.hint() << '>';
                    if ( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if ( !required )
                    os << ']';
                if ( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:\n";
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for ( auto const& cols : rows )
                optWidth = ( std::max )( optWidth, cols.left.size() + 2 );

            optWidth = ( std::min )( optWidth, consoleWidth / 2 );

            for ( auto& cols : rows ) {
                auto row = TextFlow::Column( CATCH_MOVE(cols.left) )
                               .width( optWidth )
                               .indent( 2 ) +
                           TextFlow::Spacer( 4 ) +
                           TextFlow::Column( static_cast<std::string>(cols.descriptions) )
                               .width( consoleWidth - 7 - optWidth );
                os << row << '\n';
            }
        }